

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbTest.c
# Opt level: O2

void Gia_ManDualAndN(Gia_Man_t *p,int *pLits,int n,int *LitZ)

{
  int iVar1;
  int iLit1;
  int iVar2;
  int iLit0;
  ulong uVar3;
  ulong uVar4;
  
  *LitZ = 1;
  uVar4 = 0;
  uVar3 = (ulong)(uint)n;
  if (n < 1) {
    uVar3 = uVar4;
  }
  iVar2 = 0;
  iLit0 = 0;
  for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    iVar1 = Abc_LitNot(pLits[uVar4 * 2]);
    iLit1 = Abc_LitNot(pLits[uVar4 * 2 + 1]);
    iVar1 = Gia_ManHashAnd(p,iVar1,iLit1);
    iVar2 = Gia_ManHashOr(p,iVar2,iVar1);
    iLit0 = Gia_ManHashOr(p,iLit0,pLits[uVar4 * 2 + 1]);
    iVar1 = Gia_ManHashAnd(p,*LitZ,pLits[uVar4 * 2]);
    *LitZ = iVar1;
  }
  iVar2 = Abc_LitNot(iVar2);
  iVar2 = Gia_ManHashAnd(p,iLit0,iVar2);
  LitZ[1] = iVar2;
  return;
}

Assistant:

void Gia_ManDualAndN( Gia_Man_t * p, int * pLits, int n, int LitZ[2] )
{
    int i, LitZero = 0, LitOne = 0;
    LitZ[0] = 1;
    for ( i = 0; i < n; i++ )
    {
        int Lit = Gia_ManHashAnd( p, Abc_LitNot(pLits[2*i]), Abc_LitNot(pLits[2*i+1]) );
        LitZero = Gia_ManHashOr( p, LitZero, Lit );
        LitOne  = Gia_ManHashOr( p, LitOne,  pLits[2*i+1] );
        LitZ[0] = Gia_ManHashAnd( p, LitZ[0], pLits[2*i] );
    }
    LitZ[1] = Gia_ManHashAnd( p, LitOne, Abc_LitNot(LitZero) );
    
    if ( fForceZero ) LitZ[0]   = Gia_ManHashAnd( p, LitZ[0], Abc_LitNot(LitZ[1]) );
}